

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_SetArraySegmentItem_CI4<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  int *piVar2;
  code *pcVar3;
  bool bVar4;
  Var ptr;
  undefined4 *puVar5;
  
  piVar2 = *(int **)(this + (ulong)playout->Instance * 8 + 0x160);
  uVar1 = playout->Element;
  ptr = GetReg<unsigned_int>(this,playout->Value);
  if (*piVar2 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x14d9,"(segment->left == 0)","segment->left == 0");
    if (!bVar4) goto LAB_0095fd60;
    *puVar5 = 0;
  }
  if ((uint)piVar2[1] <= uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x14da,"(index < segment->length)","index < segment->length");
    if (!bVar4) {
LAB_0095fd60:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            ((WriteBarrierPtr<void> *)(piVar2 + (ulong)uVar1 * 2 + 6),ptr);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArraySegmentItem_CI4(const unaligned T* playout)
    {
        SparseArraySegment<Var> * segment = (SparseArraySegment<Var> *)GetNonVarReg(playout->Instance);

        uint32 index = playout->Element;
        Var value = GetReg(playout->Value);

        Assert(segment->left == 0);
        Assert(index < segment->length);

        segment->elements[index] = value;
    }